

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeColumnFromOverflow
              (VdbeCursor *pC,int iCol,int t,i64 iOffset,u32 cacheStatus,u32 colCacheCtr,Mem *pDest)

{
  u8 enc;
  sqlite3 *db_00;
  long lVar1;
  u32 amt;
  int iVar2;
  VdbeTxtBlbCache *pVVar3;
  i64 iVar4;
  char *local_58;
  char *pBuf;
  VdbeTxtBlbCache *pCache;
  int len;
  int encoding;
  sqlite3 *db;
  int rc;
  u32 colCacheCtr_local;
  u32 cacheStatus_local;
  i64 iOffset_local;
  int t_local;
  int iCol_local;
  VdbeCursor *pC_local;
  
  db_00 = pDest->db;
  enc = pDest->enc;
  amt = sqlite3VdbeSerialTypeLen(t);
  if (db_00->aLimit[0] < (int)amt) {
    return 0x12;
  }
  if (((int)amt < 0xfa1) || (pC->pKeyInfo != (KeyInfo *)0x0)) {
    iVar2 = sqlite3VdbeMemFromBtree((pC->uc).pCursor,(u32)iOffset,amt,pDest);
    if (iVar2 != 0) {
      return iVar2;
    }
    sqlite3VdbeSerialGet((uchar *)pDest->z,t,pDest);
    db._4_4_ = 0;
    if (((t & 1U) != 0) && (enc == '\x01')) {
      pDest->z[(int)amt] = '\0';
      pDest->flags = pDest->flags | 0x200;
    }
  }
  else {
    if (((byte)pC->field_0x5 >> 4 & 1) == 0) {
      pVVar3 = (VdbeTxtBlbCache *)sqlite3DbMallocZero(db_00,0x20);
      pC->pCache = pVVar3;
      if (pC->pCache == (VdbeTxtBlbCache *)0x0) {
        return 7;
      }
      pC->field_0x5 = pC->field_0x5 & 0xef | 0x10;
    }
    pVVar3 = pC->pCache;
    if ((((pVVar3->pCValue == (char *)0x0) || (pVVar3->iCol != iCol)) ||
        (pVVar3->cacheStatus != cacheStatus)) ||
       ((pVVar3->colCacheCtr != colCacheCtr ||
        (lVar1 = pVVar3->iOffset, iVar4 = sqlite3BtreeOffset((pC->uc).pCursor), lVar1 != iVar4)))) {
      if (pVVar3->pCValue != (char *)0x0) {
        sqlite3RCStrUnref(pVVar3->pCValue);
      }
      local_58 = sqlite3RCStrNew((long)(int)(amt + 3));
      pVVar3->pCValue = local_58;
      if (local_58 == (char *)0x0) {
        return 7;
      }
      iVar2 = sqlite3BtreePayload((pC->uc).pCursor,(u32)iOffset,amt,local_58);
      if (iVar2 != 0) {
        return iVar2;
      }
      local_58[(int)amt] = '\0';
      local_58[(int)(amt + 1)] = '\0';
      local_58[(int)(amt + 2)] = '\0';
      pVVar3->iCol = iCol;
      pVVar3->cacheStatus = cacheStatus;
      pVVar3->colCacheCtr = colCacheCtr;
      iVar4 = sqlite3BtreeOffset((pC->uc).pCursor);
      pVVar3->iOffset = iVar4;
    }
    else {
      local_58 = pVVar3->pCValue;
    }
    sqlite3RCStrRef(local_58);
    if ((t & 1U) == 0) {
      db._4_4_ = sqlite3VdbeMemSetStr(pDest,local_58,(long)(int)amt,'\0',sqlite3RCStrUnref);
    }
    else {
      db._4_4_ = sqlite3VdbeMemSetStr(pDest,local_58,(long)(int)amt,enc,sqlite3RCStrUnref);
      pDest->flags = pDest->flags | 0x200;
    }
  }
  pDest->flags = pDest->flags & 0xbfff;
  return db._4_4_;
}

Assistant:

static SQLITE_NOINLINE int vdbeColumnFromOverflow(
  VdbeCursor *pC,       /* The BTree cursor from which we are reading */
  int iCol,             /* The column to read */
  int t,                /* The serial-type code for the column value */
  i64 iOffset,          /* Offset to the start of the content value */
  u32 cacheStatus,      /* Current Vdbe.cacheCtr value */
  u32 colCacheCtr,      /* Current value of the column cache counter */
  Mem *pDest            /* Store the value into this register. */
){
  int rc;
  sqlite3 *db = pDest->db;
  int encoding = pDest->enc;
  int len = sqlite3VdbeSerialTypeLen(t);
  assert( pC->eCurType==CURTYPE_BTREE );
  if( len>db->aLimit[SQLITE_LIMIT_LENGTH] ) return SQLITE_TOOBIG;
  if( len > 4000 && pC->pKeyInfo==0 ){
    /* Cache large column values that are on overflow pages using
    ** an RCStr (reference counted string) so that if they are reloaded,
    ** that do not have to be copied a second time.  The overhead of
    ** creating and managing the cache is such that this is only
    ** profitable for larger TEXT and BLOB values.
    **
    ** Only do this on table-btrees so that writes to index-btrees do not
    ** need to clear the cache.  This buys performance in the common case
    ** in exchange for generality.
    */
    VdbeTxtBlbCache *pCache;
    char *pBuf;
    if( pC->colCache==0 ){
      pC->pCache = sqlite3DbMallocZero(db, sizeof(VdbeTxtBlbCache) );
      if( pC->pCache==0 ) return SQLITE_NOMEM;
      pC->colCache = 1;
    }
    pCache = pC->pCache;
    if( pCache->pCValue==0
     || pCache->iCol!=iCol
     || pCache->cacheStatus!=cacheStatus
     || pCache->colCacheCtr!=colCacheCtr
     || pCache->iOffset!=sqlite3BtreeOffset(pC->uc.pCursor)
    ){
      if( pCache->pCValue ) sqlite3RCStrUnref(pCache->pCValue);
      pBuf = pCache->pCValue = sqlite3RCStrNew( len+3 );
      if( pBuf==0 ) return SQLITE_NOMEM;
      rc = sqlite3BtreePayload(pC->uc.pCursor, iOffset, len, pBuf);
      if( rc ) return rc;
      pBuf[len] = 0;
      pBuf[len+1] = 0;
      pBuf[len+2] = 0;
      pCache->iCol = iCol;
      pCache->cacheStatus = cacheStatus;
      pCache->colCacheCtr = colCacheCtr;
      pCache->iOffset = sqlite3BtreeOffset(pC->uc.pCursor);
    }else{
      pBuf = pCache->pCValue;
    }
    assert( t>=12 );
    sqlite3RCStrRef(pBuf);
    if( t&1 ){
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, encoding,
                                (void(*)(void*))sqlite3RCStrUnref);
      pDest->flags |= MEM_Term;
    }else{
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, 0,
                                (void(*)(void*))sqlite3RCStrUnref);
    }
  }else{
    rc = sqlite3VdbeMemFromBtree(pC->uc.pCursor, iOffset, len, pDest);
    if( rc ) return rc;
    sqlite3VdbeSerialGet((const u8*)pDest->z, t, pDest);
    if( (t&1)!=0 && encoding==SQLITE_UTF8 ){
      pDest->z[len] = 0;
      pDest->flags |= MEM_Term;
    }
  }
  pDest->flags &= ~MEM_Ephem;
  return rc;
}